

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool Recognition::is_real(string *str)

{
  ulong uVar1;
  invalid_argument *this;
  invalid_argument *e;
  out_of_range *e_1;
  ulong local_20;
  size_type pos;
  string *str_local;
  
  pos = (size_type)str;
  std::__cxx11::stod(str,&local_20);
  uVar1 = std::__cxx11::string::length();
  if (local_20 < uVar1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"invalid real argument");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return true;
}

Assistant:

static bool is_real(const std::string &str) {
        try {
            std::string::size_type pos;
            std::stod(str, &pos);
            if (pos < str.length()) {
                throw std::invalid_argument("invalid real argument");
            }
            return true;
        } catch (const std::invalid_argument &e) {
            return false;
        } catch (const std::out_of_range &e) {
            return false;
        }
    }